

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_set.h
# Opt level: O1

bool __thiscall
wasm::
SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
::operator==(SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
             *this,SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                   *other)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  bool bVar5;
  LocalSet **ppLVar6;
  LocalSet **ppLVar7;
  size_t sVar8;
  size_t sVar9;
  
  sVar1 = (this->fixed).super_FixedStorageBase<wasm::LocalSet_*,_2UL>.used;
  sVar2 = (this->flexible)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  sVar8 = sVar2;
  if (sVar2 == 0) {
    sVar8 = sVar1;
  }
  sVar3 = (other->fixed).super_FixedStorageBase<wasm::LocalSet_*,_2UL>.used;
  sVar4 = (other->flexible)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  sVar9 = sVar4;
  if (sVar4 == 0) {
    sVar9 = sVar3;
  }
  if (sVar8 == sVar9) {
    if (sVar2 == 0) {
      ppLVar7 = (this->fixed).super_FixedStorageBase<wasm::LocalSet_*,_2UL>.storage._M_elems + sVar1
      ;
      ppLVar6 = std::operator==(&(this->fixed).super_FixedStorageBase<wasm::LocalSet_*,_2UL>.storage
                                ,ppLVar7,other);
    }
    else {
      if (sVar4 != 0) {
        if ((this->flexible)._M_t._M_impl.super__Rb_tree_header._M_node_count ==
            (other->flexible)._M_t._M_impl.super__Rb_tree_header._M_node_count) {
          bVar5 = std::__equal<false>::
                  equal<std::_Rb_tree_const_iterator<wasm::LocalSet*>,std::_Rb_tree_const_iterator<wasm::LocalSet*>>
                            ((this->flexible)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                             (_Rb_tree_const_iterator<wasm::LocalSet_*>)
                             &(this->flexible)._M_t._M_impl.super__Rb_tree_header,
                             (other->flexible)._M_t._M_impl.super__Rb_tree_header._M_header._M_left)
          ;
          return bVar5;
        }
        goto LAB_001707f7;
      }
      ppLVar7 = (other->fixed).super_FixedStorageBase<wasm::LocalSet_*,_2UL>.storage._M_elems +
                sVar3;
      ppLVar6 = std::operator==(&(other->fixed).super_FixedStorageBase<wasm::LocalSet_*,_2UL>.
                                 storage,ppLVar7,this);
    }
    bVar5 = ppLVar6 == ppLVar7;
  }
  else {
LAB_001707f7:
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool
  operator==(const SmallSetBase<T, N, FixedStorage, FlexibleSet>& other) const {
    if (size() != other.size()) {
      return false;
    }
    if (usingFixed()) {
      return std::all_of(fixed.storage.begin(),
                         fixed.storage.begin() + fixed.used,
                         [&other](const T& x) { return other.count(x); });
    } else if (other.usingFixed()) {
      return std::all_of(other.fixed.storage.begin(),
                         other.fixed.storage.begin() + other.fixed.used,
                         [this](const T& x) { return count(x); });
    } else {
      return flexible == other.flexible;
    }
  }